

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::ClampScrollOffset(Element *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = (this->scroll_offset).x;
  fVar1 = GetScrollWidth(this);
  fVar2 = GetClientWidth(this);
  if (fVar1 - fVar2 <= fVar4) {
    fVar4 = fVar1 - fVar2;
  }
  fVar1 = Math::Round(fVar4);
  fVar4 = (this->scroll_offset).y;
  fVar2 = GetScrollHeight(this);
  fVar3 = GetClientHeight(this);
  if (fVar2 - fVar3 <= fVar4) {
    fVar4 = fVar2 - fVar3;
  }
  fVar4 = Math::Round(fVar4);
  fVar2 = (this->scroll_offset).x;
  if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
    fVar2 = (this->scroll_offset).y;
    if ((fVar4 == fVar2) && (!NAN(fVar4) && !NAN(fVar2))) goto LAB_00280359;
  }
  (this->scroll_offset).x = fVar1;
  (this->scroll_offset).y = fVar4;
  DirtyAbsoluteOffset(this);
LAB_00280359:
  ElementScroll::UpdateProperties(&this->meta->scroll);
  return;
}

Assistant:

void Element::ClampScrollOffset()
{
	const Vector2f new_scroll_offset = {
		Math::Round(Math::Min(scroll_offset.x, GetScrollWidth() - GetClientWidth())),
		Math::Round(Math::Min(scroll_offset.y, GetScrollHeight() - GetClientHeight())),
	};

	if (new_scroll_offset != scroll_offset)
	{
		scroll_offset = new_scroll_offset;
		DirtyAbsoluteOffset();
	}

	// At this point the scrollbars have been resolved, both in terms of size and visibility. Update their properties
	// now so that any visibility changes in particular are reflected immediately on the next render. Otherwise we risk
	// that the scrollbars renders a frame late, since changes to scrollbars can happen during layouting.
	meta->scroll.UpdateProperties();
}